

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false>>>
::
Intrusive_list_column<std::map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
          (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false>>>
           *this,map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 *nonZeroRowIndices,Dimension dimension,Column_settings *colSettings)

{
  iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false>_>::Matrix_column_tag,_1U>_*,_false>
  iVar1;
  uint uVar2;
  _Rb_tree_node_base *p_Var3;
  uint local_3c;
  iterator local_38;
  
  *(Dimension *)this = dimension;
  local_38.members_.nodeptr_ =
       (iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false>_>::Matrix_column_tag,_1U>_*,_false>
        )(iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false>_>::Matrix_column_tag,_1U>_*,_false>
          )nonZeroRowIndices;
  uVar2 = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false>_>_>
          ::
          Intrusive_list_column<std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>
          ::anon_class_8_1_c18eeb02::operator()((anon_class_8_1_c18eeb02 *)&local_38);
  *(uint *)(this + 4) = uVar2;
  *(undefined4 *)(this + 8) = 0xffffffff;
  *(Entry_constructor **)(this + 0x18) = &colSettings->entryConstructor;
  iVar1.nodeptr_ = (list_node<void_*> *)(this + 0x20);
  *(list_node<void_*> **)(this + 0x20) = iVar1.nodeptr_;
  *(list_node<void_*> **)(this + 0x28) = iVar1.nodeptr_;
  *(Column_settings **)(this + 0x10) = colSettings;
  for (p_Var3 = (nonZeroRowIndices->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(nonZeroRowIndices->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    local_3c = *(uint *)&p_Var3[1].field_0x4;
    if (**(uint **)(this + 0x10) <= local_3c) {
      local_3c = local_3c % **(uint **)(this + 0x10);
    }
    local_38.members_.nodeptr_ =
         (iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false>_>::Matrix_column_tag,_1U>_*,_false>
          )(iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false>_>::Matrix_column_tag,_1U>_*,_false>
            )iVar1.nodeptr_;
    Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false>_>_>
    ::_insert_entry((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false>_>_>
                     *)this,&local_3c,p_Var3[1]._M_color,&local_38);
  }
  return;
}

Assistant:

inline Intrusive_list_column<Master_matrix>::Intrusive_list_column(const Container& nonZeroRowIndices,
                                                                   Dimension dimension,
                                                                   Column_settings* colSettings)
    : RA_opt(),
      Dim_opt(dimension),
      Chain_opt([&] {
        if constexpr (Master_matrix::Option_list::is_z2) {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : *std::prev(nonZeroRowIndices.end());
        } else {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : std::prev(nonZeroRowIndices.end())->first;
        }
      }()),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor)),
      column_()
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _insert_entry(id, column_.end());
    }
  } else {
    operators_ = &(colSettings->operators);
    for (const auto& p : nonZeroRowIndices) {
      _insert_entry(operators_->get_value(p.second), p.first, column_.end());
    }
  }
}